

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsErrors.cxx
# Opt level: O0

void cmCMakePresetsErrors::FIRST_WORKFLOW_STEP_NOT_CONFIGURE(string *stepName,cmJSONState *state)

{
  string local_38;
  cmJSONState *local_18;
  cmJSONState *state_local;
  string *stepName_local;
  
  local_18 = state;
  state_local = (cmJSONState *)stepName;
  cmStrCat<char_const(&)[22],std::__cxx11::string_const&,char_const(&)[27]>
            (&local_38,(char (*) [22])"First workflow step \"",stepName,
             (char (*) [27])"\" must be a configure step");
  cmJSONState::AddError(state,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void FIRST_WORKFLOW_STEP_NOT_CONFIGURE(const std::string& stepName,
                                       cmJSONState* state)
{
  state->AddError(cmStrCat("First workflow step \"", stepName,
                           "\" must be a configure step"));
}